

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_hello_verify_request(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  byte *pbVar4;
  void *pvVar5;
  int local_28;
  int iStack_24;
  uchar cookie_len;
  int minor_ver;
  int major_ver;
  uchar *p;
  mbedtls_ssl_context *ssl_local;
  
  puVar2 = ssl->in_msg;
  p = (uchar *)ssl;
  sVar3 = mbedtls_ssl_hs_hdr_len(ssl);
  _minor_ver = puVar2 + sVar3;
  mbedtls_debug_print_msg
            ((mbedtls_ssl_context *)p,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x4a8,"=> parse hello verify request");
  mbedtls_debug_print_buf
            ((mbedtls_ssl_context *)p,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x4b0,"server version",_minor_ver,2);
  mbedtls_ssl_read_version
            (&stack0xffffffffffffffdc,&local_28,*(uint *)(*(long *)p + 0x164) >> 1 & 1,_minor_ver);
  pbVar4 = _minor_ver + 2;
  if ((((iStack_24 < 3) || (local_28 < 2)) || ((int)(uint)*(byte *)(*(long *)p + 0x160) < iStack_24)
      ) || ((int)(uint)*(byte *)(*(long *)p + 0x161) < local_28)) {
    _minor_ver = pbVar4;
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)p,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4bd,"bad server version");
    mbedtls_ssl_send_alert_message((mbedtls_ssl_context *)p,'\x02','F');
    ssl_local._4_4_ = -0x6e80;
  }
  else {
    _minor_ver = _minor_ver + 3;
    bVar1 = *pbVar4;
    mbedtls_debug_print_buf
              ((mbedtls_ssl_context *)p,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4c6,"cookie",_minor_ver,(ulong)bVar1);
    free(*(void **)(*(long *)(p + 0x60) + 0x3b8));
    pvVar5 = calloc(1,(ulong)bVar1);
    *(void **)(*(long *)(p + 0x60) + 0x3b8) = pvVar5;
    if (*(long *)(*(long *)(p + 0x60) + 0x3b8) == 0) {
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)p,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4cd,"alloc failed (%d bytes)",(ulong)bVar1);
      ssl_local._4_4_ = -0x7f00;
    }
    else {
      memcpy(*(void **)(*(long *)(p + 0x60) + 0x3b8),_minor_ver,(ulong)bVar1);
      *(byte *)(*(long *)(p + 0x60) + 0x3c0) = bVar1;
      p[8] = '\x01';
      p[9] = '\0';
      p[10] = '\0';
      p[0xb] = '\0';
      mbedtls_ssl_reset_checksum((mbedtls_ssl_context *)p);
      mbedtls_ssl_recv_flight_completed((mbedtls_ssl_context *)p);
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)p,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4da,"<= parse hello verify request");
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_hello_verify_request( mbedtls_ssl_context *ssl )
{
    const unsigned char *p = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    int major_ver, minor_ver;
    unsigned char cookie_len;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse hello verify request" ) );

    /*
     * struct {
     *   ProtocolVersion server_version;
     *   opaque cookie<0..2^8-1>;
     * } HelloVerifyRequest;
     */
    MBEDTLS_SSL_DEBUG_BUF( 3, "server version", p, 2 );
    mbedtls_ssl_read_version( &major_ver, &minor_ver, ssl->conf->transport, p );
    p += 2;

    /*
     * Since the RFC is not clear on this point, accept DTLS 1.0 (TLS 1.1)
     * even is lower than our min version.
     */
    if( major_ver < MBEDTLS_SSL_MAJOR_VERSION_3 ||
        minor_ver < MBEDTLS_SSL_MINOR_VERSION_2 ||
        major_ver > ssl->conf->max_major_ver  ||
        minor_ver > ssl->conf->max_minor_ver  )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server version" ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

    cookie_len = *p++;
    MBEDTLS_SSL_DEBUG_BUF( 3, "cookie", p, cookie_len );

    mbedtls_free( ssl->handshake->verify_cookie );

    ssl->handshake->verify_cookie = mbedtls_calloc( 1, cookie_len );
    if( ssl->handshake->verify_cookie  == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc failed (%d bytes)", cookie_len ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    memcpy( ssl->handshake->verify_cookie, p, cookie_len );
    ssl->handshake->verify_cookie_len = cookie_len;

    /* Start over at ClientHello */
    ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
    mbedtls_ssl_reset_checksum( ssl );

    mbedtls_ssl_recv_flight_completed( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse hello verify request" ) );

    return( 0 );
}